

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O1

void __thiscall imrt::Station::printAperture(Station *this,int aperture)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Station: ",9);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->angle);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," aperture: ",0xb);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,aperture);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," intensity ",0xb);
  poVar2 = std::ostream::_M_insert<double>
                     ((this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[aperture]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  iVar1 = Collimator::getXdim(this->collimator);
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)(*(long *)&(this->A).
                                             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[aperture].
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             ._M_impl.super__Vector_impl_data + lVar4 * 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-",1);
      plVar3 = (long *)std::ostream::operator<<
                                 ((ostream *)poVar2,
                                  *(int *)(*(long *)&(this->A).
                                                                                                          
                                                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [aperture].
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data + 4 + lVar4 * 8))
      ;
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      lVar4 = lVar4 + 1;
      iVar1 = Collimator::getXdim(this->collimator);
    } while (lVar4 < iVar1);
  }
  return;
}

Assistant:

void Station::printAperture(int aperture) {
    cout << "Station: "<< angle << " aperture: " << aperture << " intensity "<< intensity[aperture]<< endl;
    for (int i=0; i<collimator.getXdim(); i++) {
      cout << A[aperture][i].first << "-" << A[aperture][i].second << endl;
    }
  }